

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::CopyImage::FunctionalTest::copyAndVerify
          (FunctionalTest *this,testCase *test_case,GLubyte **dst_pixels,GLubyte **src_pixels)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  MessageBuilder *pMVar9;
  TestError *this_00;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  undefined8 local_290;
  Enum<int,_2UL> local_1f0;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar8;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  bVar3 = Utils::isTargetMultilayer((test_case->m_dst).m_target);
  bVar4 = Utils::isTargetMultilayer((test_case->m_src).m_target);
  uVar13 = 0;
  uVar11 = 1;
  if (bVar3 || bVar4) {
    if (bVar3 != bVar4) {
      uVar10 = (uint)bVar3;
      uVar6 = bVar3 ^ 1;
      local_290 = 1;
      uVar11 = 0xc;
      goto LAB_00946586;
    }
    local_290 = 0xc;
  }
  else {
    local_290 = 1;
  }
  uVar6 = 0;
  uVar10 = 0;
LAB_00946586:
  uVar14 = 0;
  uVar12 = 0;
  do {
    if (uVar11 == uVar13) {
LAB_00946a86:
      return uVar11 <= uVar13;
    }
    if (this->m_rb_name == 0) {
      (**(code **)(lVar8 + 0x310))
                (this->m_src_tex_name,(test_case->m_src).m_target,(test_case->m_src).m_level,
                 test_case->m_src_x,test_case->m_src_y,uVar14,this->m_dst_tex_name,
                 (test_case->m_dst).m_target,(test_case->m_dst).m_level,test_case->m_dst_x,
                 test_case->m_dst_y,uVar12,test_case->m_width,test_case->m_height,local_290);
    }
    else {
      (**(code **)(lVar8 + 0x310))(this->m_src_tex_name,0xde1);
      (**(code **)(lVar8 + 0x310))
                (this->m_rb_name,(test_case->m_src).m_target,(test_case->m_src).m_level,
                 test_case->m_src_x,test_case->m_src_y,uVar14 & 0xffffffff,this->m_dst_tex_name,
                 (test_case->m_dst).m_target,(test_case->m_dst).m_level,test_case->m_dst_x,
                 test_case->m_dst_y,uVar12,test_case->m_width,test_case->m_height,local_290);
    }
    iVar5 = (**(code **)(lVar8 + 0x800))();
    if (iVar5 != 0) {
LAB_009467a5:
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"Failure. Targets src: ");
      local_1f0.m_value = (test_case->m_src).m_target;
      local_1f0.m_getName = glu::getTextureTargetName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar2);
      std::operator<<((ostream *)poVar2,", dst: ");
      local_1c0.m_value = (test_case->m_dst).m_target;
      local_1c0.m_getName = glu::getTextureTargetName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar2);
      std::operator<<((ostream *)poVar2,". Levels src: ");
      pMVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&(test_case->m_src).m_level);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", dst: ")
      ;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&(test_case->m_dst).m_level);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      ". Dimmensions src [");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&(test_case->m_src).m_width);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&(test_case->m_src).m_height);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"], dst ["
                     );
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&(test_case->m_dst).m_width);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&(test_case->m_dst).m_height);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      "]. Region [");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&test_case->m_width);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>," x ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&test_case->m_height);
      poVar1 = &pMVar9->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," x ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] from [");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&test_case->m_src_x);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&test_case->m_src_y);
      poVar1 = &pMVar9->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] to [");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&test_case->m_dst_x);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&test_case->m_dst_y);
      poVar1 = &pMVar9->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]. Format src: ")
      ;
      local_1d0.m_value = (test_case->m_src).m_internal_format;
      local_1d0.m_getName = glu::getInternalFormatParameterName;
      tcu::Format::Enum<int,_2UL>::toStream
                (&local_1d0,&poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", dst: ");
      local_1e0.m_value = (test_case->m_dst).m_internal_format;
      local_1e0.m_getName = glu::getInternalFormatParameterName;
      tcu::Format::Enum<int,_2UL>::toStream
                (&local_1e0,&poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      if (iVar5 != 0) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Failed due to error: ");
        local_1f0.m_getName = glu::getErrorName;
        local_1f0.m_value = iVar5;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Copy operation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                   ,0xb7f);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      goto LAB_00946a86;
    }
    iVar7 = verify(this,(EVP_PKEY_CTX *)test_case,(uchar *)(uVar12 & 0xffffffff),(size_t)dst_pixels,
                   (uchar *)(uVar14 & 0xffffffff),(size_t)src_pixels);
    if ((char)iVar7 == '\0') goto LAB_009467a5;
    uVar13 = uVar13 + 1;
    uVar12 = uVar12 + uVar10;
    uVar14 = uVar14 + uVar6;
  } while( true );
}

Assistant:

bool FunctionalTest::copyAndVerify(const testCase& test_case, const GLubyte** dst_pixels, const GLubyte** src_pixels)
{
	GLenum			 error				= GL_NO_ERROR;
	const Functions& gl					= m_context.getRenderContext().getFunctions();
	GLuint			 region_depth		= 1;
	GLuint			 dst_layer_step		= 0;
	const bool		 is_dst_multi_layer = Utils::isTargetMultilayer(test_case.m_dst.m_target);
	const bool		 is_src_multi_layer = Utils::isTargetMultilayer(test_case.m_src.m_target);
	bool			 result				= false;
	GLuint			 src_layer_step		= 0;
	GLuint			 n_layers			= 1;

	/* Configure layers */
	if ((true == is_dst_multi_layer) || (true == is_src_multi_layer))
	{
		if (is_src_multi_layer == is_dst_multi_layer)
		{
			/* Both objects are multilayered, copy all layers at once, verify at once */
			region_depth = FUNCTIONAL_TEST_N_LAYERS;
		}
		else if (true == is_dst_multi_layer)
		{
			/* Destination is multilayered, copy each layer separetly, verify at once */
			n_layers	   = FUNCTIONAL_TEST_N_LAYERS;
			dst_layer_step = 1;
		}
		else
		{
			/* Destination is multilayered, copy and verify each layer separetly */
			n_layers	   = FUNCTIONAL_TEST_N_LAYERS;
			src_layer_step = 1;
		}
	}

	/* Copy and verification */
	{
		GLuint dst_layer = 0;
		GLuint src_layer = 0;

		/* For each layer */
		for (GLuint layer = 0; layer < n_layers; ++layer)
		{
			if (0 == m_rb_name)
			{
				gl.copyImageSubData(m_src_tex_name, test_case.m_src.m_target, test_case.m_src.m_level,
									test_case.m_src_x, test_case.m_src_y, src_layer, m_dst_tex_name,
									test_case.m_dst.m_target, test_case.m_dst.m_level, test_case.m_dst_x,
									test_case.m_dst_y, dst_layer, test_case.m_width, test_case.m_height, region_depth);
			}
			else /* Copy from src to rb and from rb to dst */
			{
				/* Src and rb shares differs only on target */
				gl.copyImageSubData(m_src_tex_name, GL_TEXTURE_2D, test_case.m_src.m_level, test_case.m_src_x,
									test_case.m_src_y, src_layer, m_rb_name, test_case.m_src.m_target,
									test_case.m_src.m_level, test_case.m_src_x, test_case.m_src_y, src_layer,
									test_case.m_width, test_case.m_height, region_depth);

				gl.copyImageSubData(m_rb_name, test_case.m_src.m_target, test_case.m_src.m_level, test_case.m_src_x,
									test_case.m_src_y, src_layer, m_dst_tex_name, test_case.m_dst.m_target,
									test_case.m_dst.m_level, test_case.m_dst_x, test_case.m_dst_y, dst_layer,
									test_case.m_width, test_case.m_height, region_depth);
			}

			/* Verify generated error */
			error = gl.getError();

			if (GL_NO_ERROR == error)
			{
				/* Verify copy results */
				result = verify(test_case, dst_layer, dst_pixels, src_layer, src_pixels, region_depth);
			}

			if ((GL_NO_ERROR != error) || (false == result))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Failure. Targets src: " << glu::getTextureTargetStr(test_case.m_src.m_target)
					<< ", dst: " << glu::getTextureTargetStr(test_case.m_dst.m_target)
					<< ". Levels src: " << test_case.m_src.m_level << ", dst: " << test_case.m_dst.m_level
					<< ". Dimmensions src [" << test_case.m_src.m_width << ", " << test_case.m_src.m_height
					<< "], dst [" << test_case.m_dst.m_width << ", " << test_case.m_dst.m_height << "]. Region ["
					<< test_case.m_width << " x " << test_case.m_height << " x " << region_depth << "] from ["
					<< test_case.m_src_x << ", " << test_case.m_src_y << ", " << src_layer << "] to ["
					<< test_case.m_dst_x << ", " << test_case.m_dst_y << ", " << dst_layer
					<< "]. Format src: " << glu::getInternalFormatParameterStr(test_case.m_src.m_internal_format)
					<< ", dst: " << glu::getInternalFormatParameterStr(test_case.m_dst.m_internal_format)
					<< tcu::TestLog::EndMessage;

				if (GL_NO_ERROR != error)
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message
														<< "Failed due to error: " << glu::getErrorStr(error)
														<< tcu::TestLog::EndMessage;

					TCU_FAIL("Copy operation failed");
				}

				return false;
			}

			/* Step one layer */
			dst_layer += dst_layer_step;
			src_layer += src_layer_step;
		}
	}

	return true;
}